

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O2

int __thiscall deqp::egl::ImageTests::init(ImageTests *this,EVP_PKEY_CTX *ctx)

{
  EglTestContext *pEVar1;
  int iVar2;
  TestNode *node;
  TestCaseGroup *pTVar3;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  node = (TestNode *)operator_new(0x78);
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"api",&local_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"EGLImage API tests",&local_62);
  Image::ApiTests::ApiTests((ApiTests *)node,pEVar1,&local_40,&local_60);
  tcu::TestNode::addChild((TestNode *)this,node);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"create",&local_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"EGLImage creation tests",&local_62);
  pTVar3 = Image::createSimpleCreationTests(pEVar1,&local_40,&local_60);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"modify",&local_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"EGLImage modifying tests",&local_62);
  pTVar3 = Image::createModifyTests(pEVar1,&local_40,&local_60);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  pEVar1 = (this->super_TestCaseGroup).m_eglTestCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"render_multiple_contexts",&local_61);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"EGLImage render tests on multiple contexts",&local_62);
  pTVar3 = Image::createMultiContextRenderTests(pEVar1,&local_40,&local_60);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  std::__cxx11::string::~string((string *)&local_60);
  iVar2 = std::__cxx11::string::~string((string *)&local_40);
  return iVar2;
}

Assistant:

void ImageTests::init (void)
{
	addChild(new Image::ApiTests(m_eglTestCtx, "api", "EGLImage API tests"));
	addChild(Image::createSimpleCreationTests(m_eglTestCtx, "create", "EGLImage creation tests"));
	addChild(Image::createModifyTests(m_eglTestCtx, "modify", "EGLImage modifying tests"));
	addChild(Image::createMultiContextRenderTests(m_eglTestCtx, "render_multiple_contexts", "EGLImage render tests on multiple contexts"));
}